

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O3

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  uint uVar1;
  size_t *in_RDX;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  size_t length;
  Status *s;
  WritableFile *local_48;
  ulong local_40;
  void *local_38;
  
  length = *in_RDX;
  uVar2 = in_RDX[1];
  bVar5 = true;
  do {
    uVar1 = (uint)slice->size_;
    if (0x7ff9 < (int)uVar1) {
      if (uVar1 < 0x8000) {
        local_40 = (ulong)(0x8000 - uVar1);
        local_48 = (WritableFile *)0x124c6b;
        (**(code **)(*(long *)slice->data_ + 0x10))(&local_38,slice->data_,(Writer *)&local_48);
        if (local_38 != (void *)0x0) {
          operator_delete__(local_38);
        }
      }
      *(undefined4 *)&slice->size_ = 0;
      uVar1 = 0;
    }
    uVar3 = (ulong)(int)(0x7ff9 - uVar1);
    uVar4 = uVar3;
    if (uVar2 < uVar3) {
      uVar4 = uVar2;
    }
    uVar1 = (uVar3 < uVar2) + 1;
    if (!bVar5) {
      uVar1 = 4 - (uVar3 < uVar2);
    }
    EmitPhysicalRecord((Writer *)&local_48,(RecordType)slice,(char *)(ulong)uVar1,length);
    if (local_48 != (WritableFile *)0x0) break;
    length = length + uVar4;
    bVar5 = false;
    uVar2 = uVar2 - uVar4;
  } while (uVar2 != 0);
  this->dest_ = local_48;
  return (Status)(char *)this;
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}